

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O1

void ForEachSortedOption(TidyDoc tdoc,OptionFunc OptionPrint)

{
  TidyOption p_Var1;
  long *plVar2;
  uint uVar3;
  ulong __nmemb;
  TidyIterator pos;
  AllOption_t tOption;
  OptionDesc local_3e8;
  TidyOption local_360;
  long local_358 [103];
  
  local_3e8.name = (ctmbstr)tidyGetOptionList(tdoc);
  __nmemb = 0;
  if ((TidyIterator)local_3e8.name != (TidyIterator)0x0) {
    do {
      p_Var1 = tidyGetNextOption(tdoc,(TidyIterator *)&local_3e8);
      local_358[__nmemb - 1] = (long)p_Var1;
      uVar3 = (int)__nmemb + 1;
      __nmemb = (ulong)uVar3;
    } while ((TidyIterator)local_3e8.name != (TidyIterator)0x0);
    __nmemb = (ulong)uVar3;
  }
  local_358[__nmemb - 1] = 0;
  qsort(&local_360,__nmemb,8,cmpOpt);
  if (local_360 != (TidyOption)0x0) {
    plVar2 = local_358;
    do {
      GetOption(tdoc,local_360,&local_3e8);
      (*OptionPrint)(tdoc,(TidyOption)plVar2[-1],&local_3e8);
      local_360 = (TidyOption)*plVar2;
      plVar2 = plVar2 + 1;
    } while (local_360 != (TidyOption)0x0);
  }
  return;
}

Assistant:

static void ForEachSortedOption(TidyDoc tdoc,          /**< The Tidy document. */
                                OptionFunc OptionPrint /**< The printing function to be used. */
                                )
{
    AllOption_t tOption;
    const TidyOption *topt;

    getSortedOption( tdoc, &tOption );
    for( topt = tOption.topt; *topt; ++topt)
    {
        OptionDesc d;

        GetOption( tdoc, *topt, &d );
        (*OptionPrint)( tdoc, *topt, &d );
    }
}